

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libformula-calc.c
# Opt level: O2

int formula(char *expr,rpf_t **rpf,variables_t *variable)

{
  byte bVar1;
  ushort uVar2;
  bool bVar3;
  byte *pbVar4;
  operation_t *poVar5;
  variables_t *pvVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  ushort **ppuVar10;
  size_t sVar11;
  rpf_t *prVar12;
  undefined8 *puVar13;
  double *pdVar14;
  rpf_t *prVar15;
  byte *pbVar16;
  ulong uVar17;
  ulong uVar18;
  int in_R8D;
  operation_t *__s;
  long lVar19;
  uint uVar20;
  rpf_type_t rVar21;
  rpf_type_t rVar22;
  ushort *puVar23;
  long lVar24;
  variables_t *pvVar25;
  byte *pbVar26;
  double dVar27;
  uint local_2160;
  int sp_op;
  ushort **local_2158;
  variables_t *local_2150;
  operation_t *local_2148;
  rpf_t **local_2140;
  rpf_t rpf_start;
  stack_t num [256];
  stack_t op [256];
  
  *rpf = (rpf_t *)0x0;
  local_2160 = 0;
  sp_op = 0;
  bVar3 = false;
  local_2150 = variable;
  local_2140 = rpf;
  do {
    prVar12 = &rpf_start;
    bVar1 = *expr;
    uVar17 = (ulong)bVar1;
    if (bVar1 == 0x28) {
      ppuVar10 = __ctype_b_loc();
      pbVar16 = (byte *)expr;
      do {
        expr = (char *)pbVar16;
        uVar17 = (ulong)*expr;
        pbVar16 = (byte *)expr + 1;
      } while ((*(byte *)((long)*ppuVar10 + uVar17 * 2 + 1) & 0x20) != 0);
      iVar9 = 0;
      while( true ) {
        cVar8 = (char)uVar17;
        if (cVar8 == '(') {
          iVar9 = iVar9 + 1;
        }
        else if ((uVar17 & 0xff) == 0) {
          return 0;
        }
        iVar9 = iVar9 - (uint)(cVar8 == ')');
        if (iVar9 == 0) break;
        uVar17 = (ulong)((byte *)expr)[1];
        expr = (char *)((byte *)expr + 1);
      }
      if (cVar8 == '\0') {
        return 0;
      }
      iVar9 = formula((char *)pbVar16,(rpf_t **)prVar12,local_2150);
      if (iVar9 == 0) {
        return 0;
      }
      if ((void *)CONCAT44(rpf_start._4_4_,rpf_start.type) != (void *)0x0) {
        lVar19 = (long)(int)local_2160;
        local_2160 = local_2160 + 1;
        num[lVar19].rank = 0;
        num[lVar19].type = TYPE_RPF;
        num[lVar19].value = (void *)CONCAT44(rpf_start._4_4_,rpf_start.type);
      }
LAB_001028df:
      bVar7 = false;
    }
    else if (bVar1 == 0x2c) {
      prVar12 = formula_output(num,(int *)&local_2160,op,&sp_op,in_R8D);
      bVar7 = false;
      if (prVar12 == (rpf_t *)0x0) {
        return 0;
      }
    }
    else {
      if ((bVar1 == 0) || (bVar1 == 0x29)) {
        prVar15 = formula_output(num,(int *)&local_2160,op,&sp_op,in_R8D);
        if (prVar15 == (rpf_t *)0x0) {
          return 0;
        }
        if (-1 < (int)local_2160) {
          if (sp_op == 0) {
            rpf_start.type = TYPE_START;
            while (uVar20 = local_2160 - 1, 0 < (int)local_2160) {
              local_2160 = uVar20;
              if (num[uVar20].type == TYPE_RPF) {
                prVar12 = rpf_join(prVar12,(rpf_t *)num[uVar20].value);
              }
              else {
                prVar12 = rpf_push(prVar12,num + uVar20);
              }
            }
            *local_2140 = rpf_start.next;
            return 1;
          }
          return 0;
        }
        return 0;
      }
      ppuVar10 = __ctype_b_loc();
      puVar23 = *ppuVar10;
      uVar2 = puVar23[(char)bVar1];
      bVar7 = false;
      if ((uVar2 >> 0xd & 1) == 0) {
        poVar5 = operation;
        local_2158 = ppuVar10;
        do {
          __s = poVar5;
          if (__s->type == TYPE_MAX) goto LAB_00102c11;
          sVar11 = strlen(__s->op);
          iVar9 = strncmp(expr,__s->op,sVar11);
          poVar5 = __s + 1;
        } while (iVar9 != 0);
        if (0 < (long)sp_op) {
          uVar20 = sp_op - 1;
          if (op[uVar20].rank == __s->rank) {
            rpf_start.type = TYPE_MATH;
            prVar12 = formula_output(num,(int *)&local_2160,num + (long)sp_op + 0xff,
                                     (int *)&rpf_start,in_R8D);
            sp_op = uVar20;
          }
          else {
            if (op[uVar20].rank <= __s->rank) goto LAB_00102924;
            prVar12 = formula_output(num,(int *)&local_2160,op,&sp_op,in_R8D);
          }
          if (prVar12 == (rpf_t *)0x0) {
            operation[0xb].rank = (int)operation[0xb]._8_8_;
            operation[0xb].type = SUB84(operation[0xb]._8_8_,4);
            return 0;
          }
        }
LAB_00102924:
        local_2148 = __s;
        sVar11 = strlen(__s->op);
        poVar5 = local_2148;
        uVar20 = local_2160;
        pbVar16 = (byte *)expr + sVar11;
        pbVar4 = (byte *)expr + sVar11;
        do {
          pbVar26 = pbVar4;
          pbVar16 = pbVar16 + 1;
          pbVar4 = pbVar26 + 1;
        } while ((*(byte *)((long)*local_2158 + (long)(char)*pbVar26 * 2 + 1) & 0x20) != 0);
        lVar19 = (long)(int)local_2160;
        if ((lVar19 == 0) && (__s->func == math_sub)) {
          num[0].rank = 0;
          num[0].type = TYPE_VALUE;
          num[0].value = malloc(8);
          *(undefined8 *)num[0].value = 0xbff0000000000000;
          local_2160 = 1;
          op[sp_op].rank = operation[0xb].rank;
          op[sp_op].type = operation[0xb].type;
          op[sp_op].value = operation + 0xb;
          rVar21 = __s->type;
LAB_00102bf1:
          sp_op = sp_op + 1;
          bVar7 = false;
          rVar22 = rVar21;
          pbVar16 = pbVar26;
        }
        else {
          rVar21 = __s->type;
          if (bVar3) {
            if (rVar21 != TYPE_MATH) {
              if (__s->func != math_sub) {
                return 0;
              }
              num[lVar19].rank = 0;
              num[lVar19].type = TYPE_VALUE;
              puVar13 = (undefined8 *)malloc(8);
              num[lVar19].value = puVar13;
              *puVar13 = 0xbff0000000000000;
              local_2160 = uVar20 + 1;
              op[sp_op].rank = operation[0xb].rank;
              op[sp_op].type = operation[0xb].type;
              op[sp_op].value = operation + 0xb;
              goto LAB_00102bf1;
            }
LAB_00102a30:
            lVar19 = (long)sp_op;
            op[lVar19].rank = __s->rank;
            op[lVar19].type = TYPE_MATH;
            op[lVar19].value = local_2148;
            sp_op = sp_op + 1;
            if (__s->narg < 1) {
              bVar7 = false;
              rVar22 = TYPE_MATH;
              pbVar16 = pbVar26;
            }
            else {
              iVar9 = 0;
              while( true ) {
                bVar1 = pbVar16[-1];
                if (bVar1 == 0x28) {
                  iVar9 = iVar9 + 1;
                }
                else if (bVar1 == 0) {
                  return 0;
                }
                iVar9 = iVar9 - (uint)(bVar1 == 0x29);
                if (iVar9 == 0) break;
                pbVar16 = pbVar16 + 1;
              }
              if (bVar1 == 0) {
                return 0;
              }
              iVar9 = formula((char *)(pbVar26 + 1),(rpf_t **)&rpf_start,local_2150);
              uVar20 = local_2160;
              if (iVar9 == 0) {
                return 0;
              }
              if ((void *)CONCAT44(rpf_start._4_4_,rpf_start.type) == (void *)0x0) {
                return 0;
              }
              lVar19 = (long)(int)local_2160;
              num[lVar19].rank = 0;
              num[lVar19].type = TYPE_RPF;
              num[lVar19].value = (void *)CONCAT44(rpf_start._4_4_,rpf_start.type);
              prVar12 = rpf_last((rpf_t *)(lVar19 * 0x10));
              uVar17 = (long)sp_op - 1;
              rpf_push(prVar12,op + uVar17);
              sp_op = (int)uVar17;
              local_2160 = uVar20 + 1;
              rVar21 = __s->type;
              bVar7 = false;
              rVar22 = TYPE_MATH;
              pbVar26 = pbVar16;
              bVar3 = false;
              if (rVar21 != TYPE_MATH) goto LAB_00102b49;
            }
          }
          else {
            uVar17 = (ulong)(uint)sp_op;
            if (rVar21 == TYPE_MATH) goto LAB_00102a30;
            bVar3 = true;
LAB_00102b49:
            bVar7 = bVar3;
            iVar9 = (int)uVar17;
            op[iVar9].rank = __s->rank;
            op[iVar9].type = rVar21;
            op[iVar9].value = poVar5;
            sp_op = iVar9 + 1;
            rVar22 = rVar21;
            pbVar16 = pbVar26;
          }
        }
        expr = (char *)(pbVar16 + -1);
        if (rVar22 == TYPE_MAX) {
          puVar23 = *local_2158;
          uVar17 = (ulong)*expr;
          uVar2 = puVar23[uVar17];
LAB_00102c11:
          uVar20 = local_2160;
          if ((uVar2 >> 10 & 1) != 0) {
            if (local_2150 == (variables_t *)0x0) {
              return 0;
            }
            uVar18 = 0;
            while ((cVar8 = (char)uVar17, cVar8 != '\0' &&
                   (((puVar23[cVar8] & 8) != 0 ||
                    ((uVar20 = ((uint)uVar17 & 0xff) - 0x5b, uVar20 < 5 &&
                     ((0x15U >> (uVar20 & 0x1f) & 1) != 0))))))) {
              *(char *)((long)&rpf_start.type + uVar18) = cVar8;
              uVar17 = (ulong)((byte *)expr)[uVar18 + 1];
              uVar18 = uVar18 + 1;
            }
            *(undefined1 *)((long)&rpf_start.type + (uVar18 & 0xffffffff)) = 0;
            pvVar6 = local_2150;
            do {
              pvVar25 = pvVar6;
              if (pvVar25->name == (char *)0x0) {
                return 0;
              }
              iVar9 = strcmp(pvVar25->name,(char *)&rpf_start);
              pvVar6 = pvVar25 + 1;
            } while (iVar9 != 0);
            lVar19 = (long)(int)local_2160;
            local_2160 = local_2160 + 1;
            num[lVar19].rank = 0;
            num[lVar19].type = TYPE_VARIABLE;
            num[lVar19].value = pvVar25->pointer;
            expr = (char *)((byte *)expr + (uVar18 - 1));
            goto LAB_001028df;
          }
          lVar19 = 0;
          while (cVar8 = (char)uVar17, cVar8 != '\0') {
            if ((*(byte *)((long)puVar23 + (long)cVar8 * 2 + 1) & 8) == 0) {
              if ((cVar8 != '.') && (lVar19 != 0 || cVar8 != '-')) break;
            }
            lVar24 = lVar19 + 1;
            lVar19 = lVar19 + 1;
            uVar17 = (ulong)((byte *)expr)[lVar24];
          }
          lVar24 = (long)(int)local_2160;
          num[lVar24].rank = 0;
          num[lVar24].type = TYPE_VALUE;
          pdVar14 = (double *)malloc(8);
          num[lVar24].value = pdVar14;
          dVar27 = strtod(expr,(char **)0x0);
          *pdVar14 = dVar27;
          local_2160 = uVar20 + 1;
          expr = (char *)((byte *)expr + lVar19 + -1);
          bVar7 = false;
        }
      }
    }
    bVar3 = bVar7;
    expr = (char *)((byte *)expr + 1);
  } while( true );
}

Assistant:

int formula(const char *expr, struct rpf_t **rpf, const struct variables_t *variable)
{
  int i;
  struct stack_t op[256];
  struct stack_t num[256];
  int sp_op, sp_num;
  struct rpf_t rpf_start;
  struct rpf_t *rpf_tmp;
  *rpf = NULL;
  int op_cont;

  sp_num = 0;
  sp_op = 0;
  op_cont = 0;
  for (; *expr; expr++)
  {
    //printf( "[o%d/n%d] %s\n", sp_op, sp_num, expr );
    if (*expr == '(')
    {
      const char *end;
      int rank2;
      struct rpf_t *rpf2;

      rank2 = 0;
      for (; isspace(*expr); expr++)
        ;
      for (end = expr; *end; end++)
      {
        if (*end == '(')
          rank2++;
        if (*end == ')')
          rank2--;
        if (rank2 == 0)
          break;
      }
      if (rank2 || !(*end))
        return 0;
      if (formula(expr + 1, &rpf2, variable) == 0)
        return 0;
      if (rpf2)
      {
        num[sp_num].rank = 0;
        num[sp_num].type = TYPE_RPF;
        num[sp_num].value = rpf2;
        sp_num++;
      }

      expr = end;
      op_cont = 0;
      continue;
    }
    else if (*expr == ')')
    {
      op_cont = 0;
      break;
    }
    else if (*expr == ',')
    {
      if (formula_output(num, &sp_num, op, &sp_op, 0) == NULL)
        return 0;
      op_cont = 0;
      continue;
    }
    else if (isspace(*expr))
    {
      op_cont = 0;
      continue;
    }
    for (i = 0; operation[i].type != TYPE_MAX; i++)
    {
      if (strstr(expr, operation[i].op) == expr)
      {
        if (sp_op > 0 && op[sp_op - 1].rank == operation[i].rank)
        {
          int sp_op2;
          sp_op2 = 1;
          if (formula_output(num, &sp_num, op + sp_op - 1, &sp_op2, operation[i].rank) == NULL)
            return 0;
          sp_op--;
        }
        else if (sp_op > 0 && op[sp_op - 1].rank > operation[i].rank)
        {
          if (formula_output(num, &sp_num, op, &sp_op, operation[i].rank) == NULL)
            return 0;
        }
        expr += strlen(operation[i].op);
        for (; isspace(*expr); expr++)
          ;

        if (sp_num == 0 && operation[i].func == math_sub)
        {
          // Case: start with -
          num[sp_num].rank = 0;
          num[sp_num].type = TYPE_VALUE;
          num[sp_num].value = malloc(sizeof(double));
          *((double *)num[sp_num].value) = -1;
          sp_num++;
          op[sp_op].rank = operation[OPERATION_MUL].rank;
          op[sp_op].type = operation[OPERATION_MUL].type;
          op[sp_op].value = &operation[OPERATION_MUL];
          sp_op++;
          op_cont = 0;
          expr--;
          break;
        }
        else if (op_cont == 1 && operation[i].type != TYPE_MATH)
        {
          if (operation[i].func == math_sub)
          {
            // Case: x*-y
            num[sp_num].rank = 0;
            num[sp_num].type = TYPE_VALUE;
            num[sp_num].value = malloc(sizeof(double));
            *((double *)num[sp_num].value) = -1;
            sp_num++;
            op[sp_op].rank = operation[OPERATION_MUL].rank;
            op[sp_op].type = operation[OPERATION_MUL].type;
            op[sp_op].value = &operation[OPERATION_MUL];
            sp_op++;
            op_cont = 0;
            expr--;
            break;
          }
          else
          {
            // Case: x*/y (Error)
            return 0;
          }
        }

        if (operation[i].type != TYPE_MATH)
        {
          op_cont = 1;
        }
        else
        {
          op[sp_op].rank = operation[i].rank;
          op[sp_op].type = operation[i].type;
          op[sp_op].value = &operation[i];
          sp_op++;
          op_cont = 0;
          if (operation[i].narg > 0)
          {
            const char *end;
            int rank2;
            struct rpf_t *rpf2;

            rank2 = 0;

            for (end = expr; *end; end++)
            {
              if (*end == '(')
                rank2++;
              if (*end == ')')
                rank2--;
              if (rank2 == 0)
                break;
            }
            if (rank2 || !(*end))
              return 0;
            if (formula(expr + 1, &rpf2, variable) == 0)
              return 0;
            if (!rpf2)
              return 0;

            num[sp_num].rank = 0;
            num[sp_num].type = TYPE_RPF;
            num[sp_num].value = rpf2;
            rpf_push(rpf_last(rpf2), &op[sp_op - 1]);
            sp_op--;
            sp_num++;
            expr = end + 1;
          }
        }
        if (operation[i].type != TYPE_MATH)
        {
          op[sp_op].rank = operation[i].rank;
          op[sp_op].type = operation[i].type;
          op[sp_op].value = &operation[i];
          sp_op++;
        }
        expr--;

        break;
      }
    }
    if (operation[i].type != TYPE_MAX)
      continue;
    op_cont = 0;
    if (isalpha(*expr))
    {
      const char *end;
      char variable_name[256];
      int i;

      if (!variable)
        return 0;

      i = 0;
      for (end = expr; *end; end++)
      {
        if (!(isalnum(*end) || *end == '_' || *end == '[' || *end == ']'))
          break;
        variable_name[i++] = *end;
      }
      variable_name[i] = 0;

      for (i = 0; variable[i].name; i++)
      {
        if (strcmp(variable[i].name, variable_name) == 0)
        {
          num[sp_num].rank = 0;
          num[sp_num].type = TYPE_VARIABLE;
          num[sp_num].value = variable[i].pointer;
          sp_num++;
          break;
        }
      }
      if (!variable[i].name)
        return 0;
      expr = end - 1;
    }
    else
    {
      const char *end;

      for (end = expr; *end; end++)
      {
        if (!(isdigit(*end) || (end == expr && *end == '-') || *end == '.'))
          break;
      }
      num[sp_num].rank = 0;
      num[sp_num].type = TYPE_VALUE;
      num[sp_num].value = malloc(sizeof(double));
      *((double *)num[sp_num].value) = strtod(expr, NULL);
      sp_num++;
      expr = end - 1;
    }
  }
  if (formula_output(num, &sp_num, op, &sp_op, 0) == NULL)
    return 0;
  if (sp_num < 0 || sp_op != 0)
    return 0;

  rpf_start.type = TYPE_START;
  rpf_tmp = &rpf_start;
  for (sp_num--; sp_num >= 0; sp_num--)
  {
    switch (num[sp_num].type)
    {
      case TYPE_RPF:
        rpf_tmp = rpf_join(rpf_tmp, num[sp_num].value);
        break;
      default:
        rpf_tmp = rpf_push(rpf_tmp, &num[sp_num]);
        break;
    }
  }
  *rpf = rpf_start.next;
  return 1;
}